

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitCallIndirect(PrintExpressionContents *this,CallIndirect *curr)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  char local_2b [3];
  
  bVar1 = curr->isReturn;
  poVar2 = this->o;
  Colors::outputColorCode(poVar2,"\x1b[35m");
  Colors::outputColorCode(poVar2,"\x1b[1m");
  if (bVar1 == true) {
    pcVar4 = "return_call_indirect ";
    lVar3 = 0x15;
  }
  else {
    pcVar4 = "call_indirect ";
    lVar3 = 0xe;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  Colors::outputColorCode(poVar2,"\x1b[0m");
  if (((this->features).features & 0x100) != 0) {
    Name::print(&curr->table,this->o);
    local_2b[2] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,local_2b + 2,1);
  }
  local_2b[1] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_2b + 1,1);
  poVar2 = this->o;
  Colors::outputColorCode(poVar2,"\x1b[33m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"type ",5);
  Colors::outputColorCode(poVar2,"\x1b[0m");
  PrintSExpression::printHeapTypeName(this->parent,(HeapType)(curr->heapType).id);
  local_2b[0] = ')';
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_2b,1);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->isReturn) {
      printMedium(o, "return_call_indirect ");
    } else {
      printMedium(o, "call_indirect ");
    }

    if (features.hasReferenceTypes()) {
      curr->table.print(o);
      o << ' ';
    }

    o << '(';
    printMinor(o, "type ");

    printHeapTypeName(curr->heapType);

    o << ')';
  }